

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+=(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var,iVar2) != CONCAT44(extraout_var_00,iVar3)) {
    TPZMatrix<long_double>::Error
              ("TPZSFMatrix<TVar> &TPZSFMatrix<long double>::operator+=(const TPZSFMatrix<TVar> &) [TVar = long double]"
               ,"Operator+= <matrixs with different dimensions>");
  }
  plVar5 = A->fElem;
  plVar6 = this->fElem;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  if (CONCAT44(extraout_var_01,iVar2) != 0 && -1 < extraout_var_01) {
    plVar4 = plVar6 + CONCAT44(extraout_var_01,iVar2);
    do {
      lVar1 = *plVar5;
      plVar5 = plVar5 + 1;
      *plVar6 = *plVar6 + lVar1;
      plVar6 = plVar6 + 1;
    } while (plVar6 < plVar4);
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZSFMatrix<TVar>  &
TPZSFMatrix<TVar> ::operator+=(const TPZSFMatrix<TVar>  &A )
{
	if ( A.Dim() != this->Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Operator+= <matrixs with different dimensions>" );
	
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ += *src++;
	
	this->fDecomposed = 0;
	return( *this );
}